

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_shl8_ins_i64(TCGContext_conflict1 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,int64_t shift)

{
  TCGTemp *ts;
  ulong arg2;
  uintptr_t o;
  TCGv_i64 ret;
  
  arg2 = (ulong)(0xff << ((byte)shift & 0x1f) & 0xff) * 0x101010101010101;
  ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)ts - (long)tcg_ctx);
  tcg_gen_shli_i64_aarch64(tcg_ctx,ret,a,shift);
  tcg_gen_andi_i64_aarch64(tcg_ctx,ret,ret,arg2);
  tcg_gen_andi_i64_aarch64(tcg_ctx,d,d,~arg2);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_or_i64,(TCGArg)(d + (long)tcg_ctx),
                      (TCGArg)(d + (long)tcg_ctx),(TCGArg)ts);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  return;
}

Assistant:

static void gen_shl8_ins_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, int64_t shift)
{
    uint64_t mask = dup_const(MO_8, 0xff << shift);
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_shli_i64(tcg_ctx, t, a, shift);
    tcg_gen_andi_i64(tcg_ctx, t, t, mask);
    tcg_gen_andi_i64(tcg_ctx, d, d, ~mask);
    tcg_gen_or_i64(tcg_ctx, d, d, t);
    tcg_temp_free_i64(tcg_ctx, t);
}